

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O1

void TTD::NSLogEvents::JsRTByteBufferAction_Parse<(TTD::NSLogEvents::EventKind)39>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  int iVar1;
  EventKind EVar2;
  TTDVar pvVar3;
  uchar *puVar4;
  ulong uVar5;
  
  if (evt->EventKind != AllocateExternalArrayBufferActionTag) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar3 = NSSnapValues::ParseTTDVar(false,reader);
  *(TTDVar *)(evt + 1) = pvVar3;
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  EVar2 = FileReader::ReadLengthValue(reader,true);
  evt[2].EventKind = EVar2;
  evt[1].EventTimeStamp = 0;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  if ((char)iVar1 != '\0') {
    return;
  }
  if ((ulong)evt[2].EventKind == 0) {
    puVar4 = (uchar *)0x0;
  }
  else {
    puVar4 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_char>(alloc,(ulong)evt[2].EventKind);
  }
  evt[1].EventTimeStamp = (int64)puVar4;
  if (evt[2].EventKind != Invalid) {
    uVar5 = 0;
    do {
      iVar1 = (*reader->_vptr_FileReader[9])(reader,(ulong)(uVar5 != 0));
      *(char *)(evt[1].EventTimeStamp + uVar5) = (char)iVar1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < evt[2].EventKind);
  }
  (*reader->_vptr_FileReader[5])(reader);
  return;
}

Assistant:

void JsRTByteBufferAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTByteBufferAction* bufferAction = GetInlineEventDataAs<JsRTByteBufferAction, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            bufferAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            bool badValue = reader->ReadBool(NSTokens::Key::boolVal, true);

            bufferAction->Length = reader->ReadLengthValue(true);
            bufferAction->Buffer = nullptr;

            reader->ReadSequenceStart_WDefaultKey(true);
            if(!badValue)
            {
                bufferAction->Buffer = (bufferAction->Length != 0) ? alloc.SlabAllocateArray<byte>(bufferAction->Length) : nullptr;

                for(uint32 i = 0; i < bufferAction->Length; ++i)
                {
                    bufferAction->Buffer[i] = reader->ReadNakedByte(i != 0);
                }
                reader->ReadSequenceEnd();
            }
        }